

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void leaveblock(FuncState *fs)

{
  BlockCnt *pBVar1;
  
  pBVar1 = fs->bl;
  fs->bl = pBVar1->previous;
  removevars(fs->ls,(uint)pBVar1->nactvar);
  if (pBVar1->upval != '\0') {
    luaK_codeABC(fs,OP_CLOSE,(uint)pBVar1->nactvar,0,0);
  }
  fs->freereg = (uint)fs->nactvar;
  luaK_patchtohere(fs,pBVar1->breaklist);
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  fs->bl = bl->previous;
  removevars(fs->ls, bl->nactvar);
  if (bl->upval)
    luaK_codeABC(fs, OP_CLOSE, bl->nactvar, 0, 0);
  /* a block either controls scope or breaks (never both) */
  lua_assert(!bl->isbreakable || !bl->upval);
  lua_assert(bl->nactvar == fs->nactvar);
  fs->freereg = fs->nactvar;  /* free registers */
  luaK_patchtohere(fs, bl->breaklist);
}